

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeSetUserData(void *cvode_mem,void *user_data)

{
  undefined8 in_RSI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x49,"CVodeSetUserData",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *(undefined8 *)(in_RDI + 0x18) = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetUserData(void* cvode_mem, void* user_data)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  cv_mem->cv_user_data = user_data;

  return (CV_SUCCESS);
}